

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialBus.cpp
# Opt level: O0

void __thiscall Commodore::Serial::DebugPort::set_input(DebugPort *this,Line line,LineLevel value)

{
  LineLevel LVar1;
  ostream *poVar2;
  char *pcVar3;
  int iVar4;
  LineLevel local_29;
  LineLevel value_local;
  Line line_local;
  DebugPort *this_local;
  
  LVar1 = value & High;
  this->input_levels_[line] = LVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"[Bus] ");
  pcVar3 = StringForLine(line);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," is ");
  pcVar3 = "low";
  if (LVar1 != Low) {
    pcVar3 = "high";
  }
  std::operator<<(poVar2,pcVar3);
  if (this->incoming_count_ == 0) {
    local_29 = Low;
    if ((this->input_levels_[2] & High) == Low) {
      local_29 = this->input_levels_[3] ^ ~Low;
    }
    iVar4 = 0;
    if ((local_29 & High) != Low) {
      iVar4 = 8;
    }
    this->incoming_count_ = iVar4;
  }
  else {
    if ((line == Clock) && (LVar1 != Low)) {
      (this->super_Port).field_0x1d =
           (byte)(this->super_Port).field_0x1d >> 1 | this->input_levels_[3] << 7;
    }
    this->incoming_count_ = this->incoming_count_ + -1;
    if (this->incoming_count_ == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[Bus] Observed value ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
      std::ostream::operator<<(poVar2,(uint)(byte)(this->super_Port).field_0x1d);
    }
  }
  return;
}

Assistant:

void DebugPort::set_input(Line line, LineLevel value) {
	input_levels_[line] = value;

	std::cout << "[Bus] " << StringForLine(line) << " is " << (value ? "high" : "low");
	if(!incoming_count_) {
		incoming_count_ = (!input_levels_[Line::Clock] && !input_levels_[Line::Data]) ? 8 : 0;
	} else {
		if(line == Line::Clock && value) {
			incoming_byte_ = (incoming_byte_ >> 1) | (input_levels_[Line::Data] ? 0x80 : 0x00);
		}
		incoming_count_--;
		if(incoming_count_ == 0) std::cout << "[Bus] Observed value " << std::hex << int(incoming_byte_);
	}
}